

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::FakeLoaderCallback::load
          (FakeLoaderCallback *this,SchemaLoader *loader,uint64_t id)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t local_30;
  unsigned_long local_28;
  
  if (id != 0x4d2) {
    uVar1 = (this->node)._reader.dataSize;
    if (uVar1 < 0x40) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(this->node)._reader.data;
    }
    local_30 = id;
    if ((uVar2 != id) && (kj::_::Debug::minSeverity < 3)) {
      if (uVar1 < 0x40) {
        local_28 = 0;
      }
      else {
        local_28 = *(this->node)._reader.data;
      }
      kj::_::Debug::log<char_const(&)[40],unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x11e,ERROR,"\"failed: expected \" \"(node.getId()) == (id)\", node.getId(), id",
                 (char (*) [40])"failed: expected (node.getId()) == (id)",&local_28,&local_30);
    }
    if ((this->loaded == true) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x11f,ERROR,"\"failed: expected \" \"!(loaded)\"",
                 (char (*) [27])"failed: expected !(loaded)");
    }
    this->loaded = true;
    SchemaLoader::loadOnce(loader,&this->node);
  }
  return;
}

Assistant:

void load(const SchemaLoader& loader, uint64_t id) const override {
    if (id == 1234) {
      // Magic "not found" ID.
      return;
    }

    EXPECT_EQ(node.getId(), id);
    EXPECT_FALSE(loaded);
    loaded = true;
    loader.loadOnce(node);
  }